

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  WatWriter *this_00;
  char *s;
  reference pvVar1;
  TryExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  Dedent(this->writer_);
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
  WritePutsSpace(this_00,s);
  Indent(this->writer_);
  pvVar1 = std::
           vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ::back(&this->writer_->label_stack_);
  pvVar1->label_type = Catch;
  WriteNewline(this->writer_,true);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
  writer_->Indent();
  writer_->label_stack_.back().label_type = LabelType::Catch;
  writer_->WriteNewline(FORCE_NEWLINE);
  return Result::Ok;
}